

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScene::mouseMoveEvent(QGraphicsScene *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  bool bVar1;
  Int IVar2;
  QGraphicsScenePrivate *this_00;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  QGraphicsSceneHoverEvent *in_RDI;
  long in_FS_OFFSET;
  QGraphicsSceneMouseEvent *unaff_retaddr;
  QGraphicsScenePrivate *d;
  QGraphicsSceneHoverEvent hover;
  QGraphicsSceneHoverEvent *in_stack_00000040;
  QGraphicsScenePrivate *in_stack_00000048;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QGraphicsScene *)0x9d2e9a);
  bVar1 = QList<QGraphicsItem_*>::isEmpty((QList<QGraphicsItem_*> *)0x9d2eb0);
  if (bVar1) {
    local_c.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)this_00);
    IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
    if (IVar2 == 0) {
      QGraphicsSceneHoverEvent::QGraphicsSceneHoverEvent(in_RDI,(Type)((ulong)in_RSI >> 0x20));
      _q_hoverFromMouseEvent((QGraphicsSceneHoverEvent *)d,unaff_retaddr);
      bVar1 = QGraphicsScenePrivate::dispatchHoverEvent(in_stack_00000048,in_stack_00000040);
      (**(code **)(*(long *)in_RSI + 0x10))(in_RSI,bVar1);
      QGraphicsSceneHoverEvent::~QGraphicsSceneHoverEvent((QGraphicsSceneHoverEvent *)0x9d2f51);
    }
  }
  else {
    __fd = (int)in_RSI;
    QGraphicsScenePrivate::sendMouseEvent
              ((QGraphicsScenePrivate *)hover.super_QGraphicsSceneEvent._8_8_,
               (QGraphicsSceneMouseEvent *)hover.super_QGraphicsSceneEvent._0_8_);
    QEvent::accept(in_RSI,__fd,__addr,in_RCX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScene::mouseMoveEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    Q_D(QGraphicsScene);
    if (d->mouseGrabberItems.isEmpty()) {
        if (mouseEvent->buttons())
            return;
        QGraphicsSceneHoverEvent hover;
        _q_hoverFromMouseEvent(&hover, mouseEvent);
        mouseEvent->setAccepted(d->dispatchHoverEvent(&hover));
        return;
    }

    // Forward the event to the mouse grabber
    d->sendMouseEvent(mouseEvent);
    mouseEvent->accept();
}